

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc-test.c++
# Opt level: O1

TestVat * __thiscall capnp::_::anon_unknown_0::TestNetwork::add(TestNetwork *this,StringPtr name)

{
  HashMap<kj::StringPtr,_kj::Own<capnp::_::(anonymous_namespace)::TestVat,_std::nullptr_t>_> *pHVar1
  ;
  Array<kj::_::HashBucket> *pAVar2;
  size_t *psVar3;
  uint uVar4;
  HashBucket *pHVar5;
  size_t sVar6;
  ArrayDisposer *pAVar7;
  size_t __n;
  RemoveConst<kj::HashMap<kj::StringPtr,_kj::Own<capnp::_::(anonymous_namespace)::TestVat>_>::Entry>
  *pRVar8;
  RemoveConst<kj::HashMap<kj::StringPtr,_kj::Own<capnp::_::(anonymous_namespace)::TestVat>_>::Entry>
  *pRVar9;
  Entry *pEVar10;
  TestNetwork *pTVar11;
  uint uVar12;
  int iVar13;
  TestVat *pTVar14;
  Iface *pIVar15;
  long lVar16;
  HashBucket *pHVar17;
  RemoveConst<kj::HashMap<kj::StringPtr,_kj::Own<capnp::_::(anonymous_namespace)::TestVat>_>::Entry>
  *pRVar18;
  Entry *pEVar19;
  Entry *pEVar20;
  TestVat *ptrCopy;
  size_t sVar21;
  HashBucket *_s944;
  HashBucket *pHVar22;
  size_t in_R8;
  ulong capacity;
  uint uVar23;
  long lVar24;
  size_t sVar25;
  Entry *pEVar26;
  ArrayPtr<const_kj::_::HashBucket> oldBuckets;
  ArrayPtr<const_unsigned_char> s;
  Array<kj::_::HashBucket> local_68;
  undefined8 *local_50;
  long local_40;
  TestNetwork *local_38;
  
  sVar21 = name.content.size_;
  s.ptr = (uchar *)name.content.ptr;
  pTVar14 = (TestVat *)operator_new(0x290);
  (pTVar14->super_TestVatBase).super_VatNetworkBase._vptr_VatNetworkBase =
       (_func_int **)&PTR_baseConnect_006e4cb8;
  pTVar14->network = this;
  (pTVar14->self).content.ptr = (char *)s.ptr;
  (pTVar14->self).content.size_ = sVar21;
  (pTVar14->connections).table.rows.builder.ptr = (Entry *)0x0;
  (pTVar14->connections).table.rows.builder.pos =
       (RemoveConst<kj::HashMap<const_capnp::_::(anonymous_namespace)::TestVat_*,_capnp::_::(anonymous_namespace)::TestVat::ConnectionImpl_*>::Entry>
        *)0x0;
  (pTVar14->connections).table.rows.builder.endPtr = (Entry *)0x0;
  pTVar14->sent = 0;
  pTVar14->received = 0;
  (pTVar14->shutdownExceptionToThrow).ptr.isSet = false;
  (pTVar14->connections).table.rows.builder.disposer =
       (ArrayDisposer *)&kj::NullArrayDisposer::instance;
  (pTVar14->connections).table.indexes.erasedCount = 0;
  (pTVar14->connections).table.indexes.buckets.ptr = (HashBucket *)0x0;
  (pTVar14->connections).table.indexes.buckets.size_ = 0;
  (pTVar14->connections).table.indexes.buckets.disposer = (ArrayDisposer *)0x0;
  (pTVar14->acceptQueue).values.
  super__List_base<kj::Own<capnp::VatNetwork<capnproto_test::capnp::test::TestSturdyRefHostId,_capnproto_test::capnp::test::TestThirdPartyCompletion,_capnproto_test::capnp::test::TestThirdPartyToAwait,_capnproto_test::capnp::test::TestThirdPartyToContact,_capnproto_test::capnp::test::TestJoinResult>::Connection,_std::nullptr_t>,_std::allocator<kj::Own<capnp::VatNetwork<capnproto_test::capnp::test::TestSturdyRefHostId,_capnproto_test::capnp::test::TestThirdPartyCompletion,_capnproto_test::capnp::test::TestThirdPartyToAwait,_capnproto_test::capnp::test::TestThirdPartyToContact,_capnproto_test::capnp::test::TestJoinResult>::Connection,_std::nullptr_t>_>_>
  ._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)&pTVar14->acceptQueue;
  (pTVar14->acceptQueue).values.
  super__List_base<kj::Own<capnp::VatNetwork<capnproto_test::capnp::test::TestSturdyRefHostId,_capnproto_test::capnp::test::TestThirdPartyCompletion,_capnproto_test::capnp::test::TestThirdPartyToAwait,_capnproto_test::capnp::test::TestThirdPartyToContact,_capnproto_test::capnp::test::TestJoinResult>::Connection,_std::nullptr_t>,_std::allocator<kj::Own<capnp::VatNetwork<capnproto_test::capnp::test::TestSturdyRefHostId,_capnproto_test::capnp::test::TestThirdPartyCompletion,_capnproto_test::capnp::test::TestThirdPartyToAwait,_capnproto_test::capnp::test::TestThirdPartyToContact,_capnproto_test::capnp::test::TestJoinResult>::Connection,_std::nullptr_t>_>_>
  ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&pTVar14->acceptQueue;
  (pTVar14->acceptQueue).values.
  super__List_base<kj::Own<capnp::VatNetwork<capnproto_test::capnp::test::TestSturdyRefHostId,_capnproto_test::capnp::test::TestThirdPartyCompletion,_capnproto_test::capnp::test::TestThirdPartyToAwait,_capnproto_test::capnp::test::TestThirdPartyToContact,_capnproto_test::capnp::test::TestJoinResult>::Connection,_std::nullptr_t>,_std::allocator<kj::Own<capnp::VatNetwork<capnproto_test::capnp::test::TestSturdyRefHostId,_capnproto_test::capnp::test::TestThirdPartyCompletion,_capnproto_test::capnp::test::TestThirdPartyToAwait,_capnproto_test::capnp::test::TestThirdPartyToContact,_capnproto_test::capnp::test::TestJoinResult>::Connection,_std::nullptr_t>_>_>
  ._M_impl._M_node._M_size = 0;
  (pTVar14->acceptQueue).waiters.queue.head.ptr = (BaseNode *)0x0;
  (pTVar14->acceptQueue).waiters.queue.tail =
       (Maybe<kj::WaiterQueue<kj::Own<capnp::VatNetwork<capnproto_test::capnp::test::TestSturdyRefHostId,_capnproto_test::capnp::test::TestThirdPartyCompletion,_capnproto_test::capnp::test::TestThirdPartyToAwait,_capnproto_test::capnp::test::TestThirdPartyToContact,_capnproto_test::capnp::test::TestJoinResult>::Connection,_std::nullptr_t>_>::BaseNode_&>
        *)&(pTVar14->acceptQueue).waiters;
  (pTVar14->acceptQueue).waiters.queue.listSize = 0;
  pIVar15 = (Iface *)operator_new(0x10);
  pIVar15->_vptr_Iface = (_func_int **)&PTR_operator___006e4d00;
  (pTVar14->sendCallback).impl.disposer =
       (Disposer *)
       &kj::_::
        HeapDisposer<kj::Function<bool(capnp::MessageBuilder&)>::Impl<capnp::_::(anonymous_namespace)::TestVat::sendCallback::{lambda(capnp::MessageBuilder&)#1}>>
        ::instance;
  (pTVar14->sendCallback).impl.ptr = pIVar15;
  (pTVar14->tphExchanges).table.rows.builder.ptr = (Entry *)0x0;
  (pTVar14->tphExchanges).table.rows.builder.pos =
       (RemoveConst<kj::HashMap<unsigned_long,_capnp::_::(anonymous_namespace)::TestVat::ThirdPartyExchange>::Entry>
        *)0x0;
  (pTVar14->tphExchanges).table.rows.builder.endPtr = (Entry *)0x0;
  (pTVar14->tphExchanges).table.rows.builder.disposer =
       (ArrayDisposer *)&kj::NullArrayDisposer::instance;
  (pTVar14->tphExchanges).table.indexes.erasedCount = 0;
  (pTVar14->tphExchanges).table.indexes.buckets.ptr = (HashBucket *)0x0;
  (pTVar14->tphExchanges).table.indexes.buckets.size_ = 0;
  (pTVar14->tphExchanges).table.indexes.buckets.disposer = (ArrayDisposer *)0x0;
  pEVar20 = (this->map).table.rows.builder.ptr;
  lVar24 = (long)(this->map).table.rows.builder.pos - (long)pEVar20;
  lVar16 = lVar24 >> 5;
  pHVar5 = (HashBucket *)(this->map).table.indexes.buckets.size_;
  if ((ulong)((long)pHVar5 * 2) < ((this->map).table.indexes.erasedCount + lVar16) * 3 + 3) {
    pAVar2 = &(this->map).table.indexes.buckets;
    oldBuckets.size_ = lVar16 * 3 + 3;
    oldBuckets.ptr = pHVar5;
    kj::_::rehash(&local_68,(_ *)pAVar2->ptr,oldBuckets,in_R8);
    pHVar5 = pAVar2->ptr;
    if (pHVar5 != (HashBucket *)0x0) {
      sVar6 = (this->map).table.indexes.buckets.size_;
      pAVar2->ptr = (HashBucket *)0x0;
      (this->map).table.indexes.buckets.size_ = 0;
      pAVar7 = (this->map).table.indexes.buckets.disposer;
      (**pAVar7->_vptr_ArrayDisposer)(pAVar7,pHVar5,8,sVar6,sVar6,0);
    }
    (this->map).table.indexes.buckets.ptr = local_68.ptr;
    (this->map).table.indexes.buckets.size_ = local_68.size_;
    (this->map).table.indexes.buckets.disposer = local_68.disposer;
    (this->map).table.indexes.erasedCount = 0;
  }
  s.size_ = sVar21 - 1;
  uVar12 = kj::_::HashCoder::operator*((HashCoder *)&kj::_::HASHCODER,s);
  pHVar1 = &this->map;
  pHVar5 = (this->map).table.indexes.buckets.ptr;
  sVar6 = (this->map).table.indexes.buckets.size_;
  uVar23 = (int)sVar6 - 1U & uVar12;
  pHVar22 = (HashBucket *)0x0;
  local_40 = lVar24;
  local_38 = this;
  do {
    pTVar11 = local_38;
    pHVar17 = pHVar5 + uVar23;
    uVar4 = pHVar17->value;
    if (uVar4 == 1) {
      if (pHVar22 == (HashBucket *)0x0) {
        pHVar22 = pHVar17;
      }
    }
    else {
      if (uVar4 == 0) {
        if (pHVar22 != (HashBucket *)0x0) {
          psVar3 = &(local_38->map).table.indexes.erasedCount;
          *psVar3 = *psVar3 - 1;
          pHVar17 = pHVar22;
        }
        *pHVar17 = (HashBucket)((ulong)uVar12 + local_40 * 0x8000000 + 0x200000000);
        pRVar18 = (local_38->map).table.rows.builder.pos;
        pRVar8 = (local_38->map).table.rows.builder.endPtr;
        if (pRVar18 == pRVar8) {
          pRVar9 = (pHVar1->table).rows.builder.ptr;
          capacity = 4;
          if (pRVar8 != pRVar9) {
            capacity = (long)pRVar8 - (long)pRVar9 >> 4;
          }
          if (capacity < (ulong)((long)pRVar18 - (long)pRVar9 >> 5)) {
            while (pRVar9 + capacity < pRVar18) {
              (pTVar11->map).table.rows.builder.pos = pRVar18 + -1;
              if (pRVar18[-1].value.ptr != (TestVat *)0x0) {
                pRVar18[-1].value.ptr = (TestVat *)0x0;
                (**(pRVar18[-1].value.disposer)->_vptr_Disposer)();
              }
              pRVar18 = (pTVar11->map).table.rows.builder.pos;
            }
          }
          pEVar19 = (Entry *)kj::_::HeapArrayDisposer::allocateImpl
                                       (0x20,0,capacity,(_func_void_void_ptr *)0x0,
                                        (_func_void_void_ptr *)0x0);
          local_50 = &kj::_::HeapArrayDisposer::instance;
          pEVar10 = (pTVar11->map).table.rows.builder.pos;
          pEVar26 = pEVar19;
          for (pEVar20 = (pTVar11->map).table.rows.builder.ptr; pEVar20 != pEVar10;
              pEVar20 = pEVar20 + 1) {
            sVar6 = (pEVar20->key).content.size_;
            (pEVar26->key).content.ptr = (pEVar20->key).content.ptr;
            (pEVar26->key).content.size_ = sVar6;
            (pEVar26->value).disposer = (pEVar20->value).disposer;
            (pEVar26->value).ptr = (pEVar20->value).ptr;
            (pEVar20->value).ptr = (TestVat *)0x0;
            pEVar26 = pEVar26 + 1;
          }
          pEVar20 = (pHVar1->table).rows.builder.ptr;
          if (pEVar20 != (Entry *)0x0) {
            pRVar18 = (pTVar11->map).table.rows.builder.pos;
            pEVar10 = (pTVar11->map).table.rows.builder.endPtr;
            (pHVar1->table).rows.builder.ptr = (Entry *)0x0;
            (this->map).table.rows.builder.pos =
                 (RemoveConst<kj::HashMap<kj::StringPtr,_kj::Own<capnp::_::(anonymous_namespace)::TestVat>_>::Entry>
                  *)0x0;
            (this->map).table.rows.builder.endPtr = (Entry *)0x0;
            pAVar7 = (pTVar11->map).table.rows.builder.disposer;
            local_68.ptr = (HashBucket *)pEVar19;
            local_68.size_ = (size_t)pEVar26;
            local_68.disposer = (ArrayDisposer *)(pEVar19 + capacity);
            (**pAVar7->_vptr_ArrayDisposer)
                      (pAVar7,pEVar20,0x20,(long)pRVar18 - (long)pEVar20 >> 5,
                       (long)pEVar10 - (long)pEVar20 >> 5,
                       kj::ArrayDisposer::
                       Dispose_<kj::HashMap<kj::StringPtr,_kj::Own<capnp::_::(anonymous_namespace)::TestVat,_std::nullptr_t>_>::Entry>
                       ::destruct);
          }
          (pTVar11->map).table.rows.builder.ptr = pEVar19;
          (pTVar11->map).table.rows.builder.pos = pEVar26;
          (pTVar11->map).table.rows.builder.endPtr = pEVar19 + capacity;
          (pTVar11->map).table.rows.builder.disposer =
               (ArrayDisposer *)&kj::_::HeapArrayDisposer::instance;
        }
        pRVar18 = (pTVar11->map).table.rows.builder.pos;
        (pRVar18->key).content.ptr = (char *)s.ptr;
        (pRVar18->key).content.size_ = sVar21;
        (pRVar18->value).disposer =
             (Disposer *)&kj::_::HeapDisposer<capnp::_::(anonymous_namespace)::TestVat>::instance;
        (pRVar18->value).ptr = pTVar14;
        pRVar18 = (pTVar11->map).table.rows.builder.pos;
        (pTVar11->map).table.rows.builder.pos = pRVar18 + 1;
        return (pRVar18->value).ptr;
      }
      if (pHVar17->hash == uVar12) {
        __n = pEVar20[uVar4 - 2].key.content.size_;
        if ((__n == sVar21) &&
           ((__n == 0 || (iVar13 = bcmp(pEVar20[uVar4 - 2].key.content.ptr,s.ptr,__n), iVar13 == 0))
           )) {
          kj::_::throwDuplicateTableRow();
        }
      }
    }
    sVar25 = (ulong)uVar23 + 1;
    uVar23 = (uint)sVar25;
    if (sVar25 == sVar6) {
      uVar23 = 0;
    }
  } while( true );
}

Assistant:

TestVat& TestNetwork::add(kj::StringPtr name) {
  return *map.insert(name, kj::heap<TestVat>(*this, name)).value;
}